

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int lhRestoreSpace(lhpage *pPage,sxu16 iOfft,sxu16 nByte)

{
  sxu16 sVar1;
  uchar *puVar2;
  uint in_EAX;
  
  if (3 < nByte) {
    puVar2 = pPage->pRaw->zData;
    in_EAX = (uint)iOfft;
    sVar1 = (pPage->sHdr).iFree;
    puVar2[(ulong)iOfft + 1] = (uchar)sVar1;
    puVar2[iOfft] = (uchar)(sVar1 >> 8);
    puVar2[(ulong)iOfft + 3] = (uchar)nByte;
    puVar2[(ulong)iOfft + 2] = (uchar)(nByte >> 8);
    *(sxu16 *)(pPage->pRaw->zData + 2) = iOfft << 8 | iOfft >> 8;
    (pPage->sHdr).iFree = iOfft;
    pPage->nFree = pPage->nFree + nByte;
  }
  return in_EAX;
}

Assistant:

static int lhRestoreSpace(lhpage *pPage,sxu16 iOfft,sxu16 nByte)
{
	unsigned char *zRaw;
	if( nByte < 4 ){
		/* At least 4 bytes of freespace must form a valid block */
		return UNQLITE_OK;
	}
	/* pEngine->pIo->xWrite() has been successfully called on this page */
	zRaw = &pPage->pRaw->zData[iOfft];
	/* Mark as a free block */
	SyBigEndianPack16(zRaw,pPage->sHdr.iFree); /* Offset of the next free block */
	zRaw += 2;
	SyBigEndianPack16(zRaw,nByte);
	/* Link */
	SyBigEndianPack16(&pPage->pRaw->zData[2/* offset of the first cell */],iOfft);
	pPage->sHdr.iFree = iOfft;
	pPage->nFree += nByte;
	return UNQLITE_OK;
}